

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::ScannersMixin::FreeBody(ScannersMixin *this,ArenaAllocator *rtAllocator)

{
  ScannerInfo *this_00;
  nullptr_t local_28;
  int local_1c;
  ArenaAllocator *pAStack_18;
  int i;
  ArenaAllocator *rtAllocator_local;
  ScannersMixin *this_local;
  
  pAStack_18 = rtAllocator;
  rtAllocator_local = (ArenaAllocator *)this;
  for (local_1c = 0; local_1c < this->numLiterals; local_1c = local_1c + 1) {
    this_00 = Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator->(this->infos + local_1c)
    ;
    ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::FreeBody
              (&this_00->super_ScannerMixin,pAStack_18);
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>::operator=(this->infos + local_1c,&local_28);
  }
  this->numLiterals = 0;
  return;
}

Assistant:

void ScannersMixin::FreeBody(ArenaAllocator* rtAllocator)
    {
        for (int i = 0; i < numLiterals; i++)
        {
            infos[i]->FreeBody(rtAllocator);
#if DBG
            infos[i] = nullptr;
#endif
        }
#if DBG
        numLiterals = 0;
#endif
    }